

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mhitm.c
# Opt level: O2

long attk_protection(int aatyp)

{
  long lStack_8;
  
  switch(aatyp) {
  case 0:
  case 10:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
    return -1;
  case 2:
  case 6:
  case 8:
  case 9:
  case 0xb:
    return 0;
  case 3:
    lStack_8 = 0x20;
    break;
  case 4:
    lStack_8 = 4;
    break;
  case 7:
    lStack_8 = 0x12;
    break;
  default:
    if (aatyp == 0xff) {
      return -1;
    }
    if (aatyp != 0xfe) {
      return 0;
    }
  case 1:
  case 5:
    lStack_8 = 0x10;
  }
  return lStack_8;
}

Assistant:

long attk_protection(int aatyp)
{
    long w_mask = 0L;

    switch (aatyp) {
    case AT_NONE:
    case AT_SPIT:
    case AT_EXPL:
    case AT_BOOM:
    case AT_GAZE:
    case AT_BREA:
    case AT_MAGC:
	w_mask = ~0L;		/* special case; no defense needed */
	break;
    case AT_CLAW:
    case AT_TUCH:
    case AT_WEAP:
	w_mask = W_ARMG;	/* caller needs to check for weapon */
	break;
    case AT_KICK:
	w_mask = W_ARMF;
	break;
    case AT_BUTT:
	w_mask = W_ARMH;
	break;
    case AT_HUGS:
	w_mask = (W_ARMC|W_ARMG); /* attacker needs both to be protected */
	break;
    case AT_BITE:
    case AT_STNG:
    case AT_ENGL:
    case AT_TENT:
    default:
	w_mask = 0L;		/* no defense available */
	break;
    }
    return w_mask;
}